

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool goodToCopy(Options *options,QString *file,QStringList *unmetDependencies)

{
  QString *pQVar1;
  long lVar2;
  QtDependency *pQVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  QString *lib;
  QString *relativeFileName;
  long in_FS_OFFSET;
  QLatin1String QVar8;
  QString local_b8;
  QtDependency local_a0;
  QArrayDataPointer<QtDependency> local_70;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar8.m_data = (char *)0x3;
  QVar8.m_size = (qsizetype)file;
  cVar4 = QString::endsWith(QVar8,0x1463ac);
  bVar5 = true;
  if (cVar4 != '\0') {
    bVar5 = checkArchitecture(options,file);
    if (bVar5) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      getQtLibsFromElf((QStringList *)&local_58,options,file);
      if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
        bVar5 = true;
      }
      else {
        pQVar1 = local_58.ptr + local_58.size;
        bVar5 = true;
        relativeFileName = local_58.ptr;
        do {
          QHash<QString,_QList<QtDependency>_>::value
                    ((QList<QtDependency> *)&local_70,&options->qtDependencies,
                     &options->currentArchitecture);
          absoluteFilePath(&local_b8,options,relativeFileName);
          pQVar3 = local_70.ptr;
          local_a0.relativePath.d.d = (relativeFileName->d).d;
          local_a0.relativePath.d.ptr = (relativeFileName->d).ptr;
          local_a0.relativePath.d.size = (relativeFileName->d).size;
          if (&(local_a0.relativePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((local_a0.relativePath.d.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((local_a0.relativePath.d.d)->super_QArrayData).ref_)->ref_).
                 _q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_a0.absolutePath.d.d = local_b8.d.d;
          local_a0.absolutePath.d.ptr = local_b8.d.ptr;
          local_a0.absolutePath.d.size = local_b8.d.size;
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          bVar6 = true;
          if (local_70.size != 0) {
            lVar2 = local_70.size * 0x30;
            lVar7 = 0;
            do {
              if (lVar2 == lVar7) {
                bVar6 = true;
                goto LAB_00121757;
              }
              bVar6 = QtDependency::operator==
                                ((QtDependency *)((long)&(pQVar3->relativePath).d.d + lVar7),
                                 &local_a0);
              lVar7 = lVar7 + 0x30;
            } while (!bVar6);
            bVar6 = (long)local_70.ptr - (long)pQVar3 == lVar7;
          }
LAB_00121757:
          if (&(local_a0.absolutePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_a0.absolutePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i = ((local_a0.absolutePath.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_a0.absolutePath.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_a0.absolutePath.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_a0.relativePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_a0.relativePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i = ((local_a0.relativePath.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_a0.relativePath.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_a0.relativePath.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
            }
          }
          QArrayDataPointer<QtDependency>::~QArrayDataPointer(&local_70);
          if (bVar6) {
            QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                      ((QMovableArrayOps<QString> *)unmetDependencies,(unmetDependencies->d).size,
                       relativeFileName);
            QList<QString>::end(unmetDependencies);
            bVar5 = false;
          }
          relativeFileName = relativeFileName + 1;
        } while (relativeFileName != pQVar1);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    }
    else {
      bVar5 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool goodToCopy(const Options *options, const QString &file, QStringList *unmetDependencies)
{
    if (!file.endsWith(".so"_L1))
        return true;

    if (!checkArchitecture(*options, file))
        return false;

    bool ret = true;
    const auto libs = getQtLibsFromElf(*options, file);
    for (const QString &lib : libs) {
        if (!options->qtDependencies[options->currentArchitecture].contains(QtDependency(lib, absoluteFilePath(options, lib)))) {
            ret = false;
            unmetDependencies->append(lib);
        }
    }

    return ret;
}